

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_b64encode.c
# Opt level: O1

int archive_write_add_filter_b64encode(archive *_a)

{
  int iVar1;
  archive_write_filter *paVar2;
  undefined4 *puVar3;
  int iVar4;
  
  paVar2 = __archive_write_allocate_filter(_a);
  iVar1 = __archive_check_magic(_a,0xb0c5c0de,1,"archive_write_add_filter_b64encode");
  iVar4 = -0x1e;
  if (iVar1 != -0x1e) {
    puVar3 = (undefined4 *)calloc(1,0x88);
    if (puVar3 == (undefined4 *)0x0) {
      archive_set_error(paVar2->archive,0xc,"Can\'t allocate data for b64encode filter");
    }
    else {
      *(undefined8 *)(puVar3 + 4) = 0;
      archive_strncat((archive_string *)(puVar3 + 2),"-",1);
      *puVar3 = 0x1a4;
      paVar2->data = puVar3;
      paVar2->name = "b64encode";
      paVar2->code = 7;
      paVar2->open = archive_filter_b64encode_open;
      paVar2->options = archive_filter_b64encode_options;
      paVar2->write = archive_filter_b64encode_write;
      paVar2->close = archive_filter_b64encode_close;
      paVar2->free = archive_filter_b64encode_free;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int
archive_write_add_filter_b64encode(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct archive_write_filter *f = __archive_write_allocate_filter(_a);
	struct private_b64encode *state;

	archive_check_magic(&a->archive, ARCHIVE_WRITE_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_write_add_filter_b64encode");

	state = calloc(1, sizeof(*state));
	if (state == NULL) {
		archive_set_error(f->archive, ENOMEM,
		    "Can't allocate data for b64encode filter");
		return (ARCHIVE_FATAL);
	}
	archive_strcpy(&state->name, "-");
	state->mode = 0644;

	f->data = state;
	f->name = "b64encode";
	f->code = ARCHIVE_FILTER_UU;
	f->open = archive_filter_b64encode_open;
	f->options = archive_filter_b64encode_options;
	f->write = archive_filter_b64encode_write;
	f->close = archive_filter_b64encode_close;
	f->free = archive_filter_b64encode_free;

	return (ARCHIVE_OK);
}